

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O2

JsErrorCode JsDiagStopDebugging(JsRuntimeHandle runtimeHandle,void **callbackState)

{
  ThreadContext *pTVar1;
  ScriptContext *this;
  ProbeContainer *this_00;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  HRESULT hr;
  JsrtRuntime *this_01;
  JsrtDebugManager *this_02;
  undefined4 *puVar5;
  DebugContext *pDVar6;
  void *pvVar7;
  ScriptContext **ppSVar8;
  JsErrorCode JVar9;
  AutoNestedHandledExceptionType local_68 [2];
  TTDebuggerAbortException anon_var_0;
  ThreadContextScope local_40;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar9 = JsErrorInvalidArgument;
  }
  else {
    if (callbackState != (void **)0x0) {
      *callbackState = (void *)0x0;
    }
    this_01 = JsrtRuntime::FromHandle(runtimeHandle);
    pTVar1 = this_01->threadContext;
    if (pTVar1->recycler != (Recycler *)0x0) {
      bVar3 = Memory::Recycler::IsHeapEnumInProgress(pTVar1->recycler);
      JVar9 = JsErrorHeapEnumInProgress;
      if (bVar3) goto LAB_003a0bf8;
    }
    JVar9 = JsErrorInThreadServiceCallback;
    if (((pTVar1->threadService).isInCallback == false) &&
       (JVar9 = JsErrorRuntimeInUse, pTVar1->callRootLevel == 0)) {
      ThreadContextScope::ThreadContextScope(&local_40,pTVar1);
      JVar9 = JsErrorWrongThread;
      if (local_40.isValid == true) {
        this_02 = JsrtRuntime::GetJsrtDebugManager(this_01);
        JVar9 = JsErrorDiagNotInDebugMode;
        if (this_02 != (JsrtDebugManager *)0x0) {
          bVar3 = JsrtDebugManager::IsDebugEventCallbackSet(this_02);
          if (bVar3) {
            pTVar1 = this_01->threadContext;
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            ppSVar8 = &pTVar1->scriptContextList;
            while (this = *ppSVar8, this != (ScriptContext *)0x0) {
              iVar4 = (*(this->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this);
              if ((char)iVar4 != '\0') break;
              bVar3 = Js::ScriptContext::IsScriptContextInDebugMode(this);
              if (!bVar3) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar5 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDiag.cpp"
                                   ,0x91,"(scriptContext->IsScriptContextInDebugMode())",
                                   "scriptContext->IsScriptContextInDebugMode()");
                if (!bVar3) goto LAB_003a0dc2;
                *puVar5 = 0;
              }
              hr = Js::ScriptContext::OnDebuggerDetached(this);
              if (hr < 0) {
                Debugger_AttachDetach_unrecoverable_error(hr);
                ThreadContextScope::~ThreadContextScope(&local_40);
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar5 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                                   ,0x89,
                                   "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                                   ,
                                   "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                                  );
                if (!bVar3) {
LAB_003a0dc2:
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                *puVar5 = 0;
                JVar9 = JsErrorFatal;
                goto LAB_003a0bf8;
              }
              pDVar6 = Js::ScriptContext::GetDebugContext(this);
              this_00 = pDVar6->diagProbesContainer;
              Js::ProbeContainer::UninstallInlineBreakpointProbe(this_00,(HaltCallback *)0x0);
              Js::ProbeContainer::UninstallDebuggerScriptOptionCallback(this_00);
              JsrtDebugManager::ClearBreakpointDebugDocumentDictionary(this_02);
              ppSVar8 = &this->next;
            }
            pvVar7 = JsrtDebugManager::GetAndClearCallbackState(this_02);
            JVar9 = JsNoError;
            if (callbackState != (void **)0x0) {
              *callbackState = pvVar7;
            }
          }
        }
      }
      ThreadContextScope::~ThreadContextScope(&local_40);
    }
  }
LAB_003a0bf8:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
  return JVar9;
}

Assistant:

CHAKRA_API JsDiagStopDebugging(
    _In_ JsRuntimeHandle runtimeHandle,
    _Out_opt_ void** callbackState)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {

        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        if (callbackState != nullptr)
        {
            *callbackState = nullptr;
        }

        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
        ThreadContext * threadContext = runtime->GetThreadContext();

        VALIDATE_RUNTIME_STATE_FOR_START_STOP_DEBUGGING(threadContext);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        for (Js::ScriptContext *scriptContext = runtime->GetThreadContext()->GetScriptContextList();
        scriptContext != nullptr && !scriptContext->IsClosed();
            scriptContext = scriptContext->next)
        {
            Assert(scriptContext->IsScriptContextInDebugMode());

            HRESULT hr;
            if (FAILED(hr = scriptContext->OnDebuggerDetached()))
            {
                Debugger_AttachDetach_unrecoverable_error(hr); // Inconsistent state, we can't continue from here
                return JsErrorFatal;
            }

            Js::DebugContext* debugContext = scriptContext->GetDebugContext();

            Js::ProbeContainer* probeContainer = debugContext->GetProbeContainer();
            probeContainer->UninstallInlineBreakpointProbe(nullptr);
            probeContainer->UninstallDebuggerScriptOptionCallback();

            jsrtDebugManager->ClearBreakpointDebugDocumentDictionary();
        }

        void* cbState = jsrtDebugManager->GetAndClearCallbackState();

        if (callbackState != nullptr)
        {
            *callbackState = cbState;
        }

        return JsNoError;
    });
#endif
}